

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtest.c
# Opt level: O3

int cmp_msg(long *msg,long *msg2,int n,int i)

{
  ulong uVar1;
  ulong uVar2;
  int i_1;
  int i_2;
  
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
    uVar1 = 0;
    do {
      if (msg[uVar1] != msg2[uVar1]) {
        printf("Received message %d doesn\'t match sent message\n",(ulong)(uint)i);
        printf("in: ");
        uVar1 = 0;
        do {
          printf(" %li",msg[uVar1]);
          uVar1 = uVar1 + 1;
        } while (uVar2 != uVar1);
        putchar(10);
        printf("out:");
        uVar1 = 0;
        do {
          printf(" %li",msg2[uVar1]);
          uVar1 = uVar1 + 1;
        } while (uVar2 != uVar1);
        putchar(10);
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  return 1;
}

Assistant:

int cmp_msg(long msg[], long msg2[], int n, int i)
{
    int j;
    for (j = 0; j < n; j++) {
        if (msg[j] != msg2[j]) {
            printf("Received message %d doesn't match sent message\n", i);
            printf("in: "); print_msg(msg, n); printf("\n");
            printf("out:"); print_msg(msg2, n); printf("\n");
            return FALSE;
        }
    }
    return TRUE;
}